

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O1

shared_ptr<tonk::gateway::MappedPortLifetime>
tonk::gateway::RequestPortMap(uint16_t localPort,char *interfaceAddress)

{
  ulong uVar1;
  undefined1 *puVar2;
  AppRequest *pAVar3;
  char *pcVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  int iVar6;
  OutputWorker *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined6 in_register_0000003a;
  element_type *peVar7;
  shared_ptr<tonk::gateway::MappedPortLifetime> sVar8;
  Result result;
  AppRequest request;
  shared_ptr<tonk::gateway::MappedPortLifetime> ref;
  undefined1 local_1d0 [8];
  string local_1c8;
  undefined1 local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  ostringstream local_198 [112];
  ios_base local_128 [272];
  
  peVar7 = (element_type *)CONCAT62(in_register_0000003a,localPort);
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)APILock);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  if (API_References < 1) {
    Delete_PortMapper();
    m_PortMapper = (char *)operator_new(0x18,(nothrow_t *)&std::nothrow);
    if (m_PortMapper == (char *)0x0) {
      m_PortMapper = (char *)0x0;
    }
    else {
      m_PortMapper[0] = '\0';
      m_PortMapper[1] = '\0';
      m_PortMapper[2] = '\0';
      m_PortMapper[3] = '\0';
      m_PortMapper[4] = '\0';
      m_PortMapper[5] = '\0';
      m_PortMapper[6] = '\0';
      m_PortMapper[7] = '\0';
      m_PortMapper[8] = '\0';
      m_PortMapper[9] = '\0';
      m_PortMapper[10] = '\0';
      m_PortMapper[0xb] = '\0';
      m_PortMapper[0xc] = '\0';
      m_PortMapper[0xd] = '\0';
      m_PortMapper[0xe] = '\0';
      m_PortMapper[0xf] = '\0';
      m_PortMapper[0x10] = '\0';
      m_PortMapper[0x11] = '\0';
      m_PortMapper[0x12] = '\0';
      m_PortMapper[0x13] = '\0';
      m_PortMapper[0x14] = '\0';
      m_PortMapper[0x15] = '\0';
      m_PortMapper[0x16] = '\0';
      m_PortMapper[0x17] = '\0';
    }
    if (m_PortMapper == (char *)0x0) {
      (peVar7->Request).LocalPort = 0;
      *(undefined2 *)&(peVar7->Request).field_0x2 = 0;
      (peVar7->Request).Type = Add;
      (peVar7->Request).API_LifetimePtr = (MappedPortLifetime *)0x0;
      goto LAB_0013898c;
    }
    GatewayPortMapper::Initialize((GatewayPortMapper *)local_1d0,m_PortMapper);
    if (local_1d0 != (undefined1  [8])0x0) {
      Result::ToJson_abi_cxx11_((string *)(local_1d0 + 8),(Result *)local_1d0);
      if (DAT_001bde60 < 5) {
        local_1a8 = (undefined1  [8])ModuleLogger;
        _Stack_1a0._M_pi._0_4_ = 4;
        std::__cxx11::ostringstream::ostringstream(local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,DAT_001bde90,DAT_001bde98);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,"Unable to initialize port mapper: ",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,
                   (char *)CONCAT44(local_1c8._M_dataplus._M_p._4_4_,
                                    CONCAT22(local_1c8._M_dataplus._M_p._2_2_,
                                             local_1c8._M_dataplus._M_p._0_2_)),
                   local_1c8._M_string_length);
        this = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this,(LogStringBuffer *)local_1a8);
        std::__cxx11::ostringstream::~ostringstream(local_198);
        std::ios_base::~ios_base(local_128);
      }
      puVar2 = (undefined1 *)
               CONCAT44(local_1c8._M_dataplus._M_p._4_4_,
                        CONCAT22(local_1c8._M_dataplus._M_p._2_2_,local_1c8._M_dataplus._M_p._0_2_))
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2 != &local_1c8.field_2) {
        operator_delete(puVar2);
      }
      Delete_PortMapper();
      (peVar7->Request).LocalPort = 0;
      *(undefined2 *)&(peVar7->Request).field_0x2 = 0;
      (peVar7->Request).Type = Add;
      (peVar7->Request).API_LifetimePtr = (MappedPortLifetime *)0x0;
      Result::~Result((Result *)local_1d0);
      goto LAB_0013898c;
    }
    Result::~Result((Result *)local_1d0);
  }
  local_1a8 = (undefined1  [8])operator_new(0x18,(nothrow_t *)&std::nothrow);
  if (local_1a8 == (undefined1  [8])0x0) {
    local_1a8 = (undefined1  [8])0x0;
  }
  else {
    *(uint16_t *)&((SSDPRequester *)local_1a8)->State = 0;
    *(undefined2 *)((long)&((SSDPRequester *)local_1a8)->State + 2) = 0;
    *(RequestType *)((long)&((SSDPRequester *)local_1a8)->State + 4) = Add;
    ((SSDPRequester *)local_1a8)->Host = (AsioHost *)0x0;
    (((SSDPRequester *)local_1a8)->LAN).Gateway.type_ = ipv4;
    (((SSDPRequester *)local_1a8)->LAN).Gateway.ipv4_address_ = (in4_addr_type)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tonk::gateway::MappedPortLifetime*>(&_Stack_1a0,(MappedPortLifetime *)local_1a8);
  pcVar4 = m_PortMapper;
  if (local_1a8 == (undefined1  [8])0x0) {
    (peVar7->Request).LocalPort = 0;
    *(undefined2 *)&(peVar7->Request).field_0x2 = 0;
    (peVar7->Request).Type = Add;
    (peVar7->Request).API_LifetimePtr = (MappedPortLifetime *)0x0;
  }
  else {
    if (m_PortMapper != (char *)0x0) {
      local_1c8._M_dataplus._M_p._4_4_ = 0;
      local_1c8._M_string_length = (size_type)local_1a8;
      uVar1 = (ulong)CONCAT22(local_1c8._M_dataplus._M_p._2_2_,(short)interfaceAddress);
      pAVar3 = (AppRequest *)local_1a8;
      pAVar3->LocalPort = (short)uVar1;
      *(short *)&pAVar3->field_0x2 = (short)(uVar1 >> 0x10);
      pAVar3->Type = (int)(uVar1 >> 0x20);
      *(undefined1 (*) [8])((long)local_1a8 + 8) = local_1a8;
      local_1c8._M_dataplus._M_p._0_2_ = (short)interfaceAddress;
      StateMachine::API_Request(*(StateMachine **)(pcVar4 + 0x10),(AppRequest *)(local_1d0 + 8));
    }
    _Var5._M_pi = _Stack_1a0._M_pi;
    API_References = API_References + 1;
    (peVar7->Request).API_LifetimePtr = (MappedPortLifetime *)0x0;
    _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (peVar7->Request).LocalPort = local_1a8._0_2_;
    *(undefined2 *)&(peVar7->Request).field_0x2 = local_1a8._2_2_;
    (peVar7->Request).Type = local_1a8._4_4_;
    (peVar7->Request).API_LifetimePtr = (MappedPortLifetime *)_Var5._M_pi;
    local_1a8 = (undefined1  [8])0x0;
  }
  if ((MappedPortLifetime *)_Stack_1a0._M_pi != (MappedPortLifetime *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
  }
LAB_0013898c:
  pthread_mutex_unlock((pthread_mutex_t *)APILock);
  sVar8.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar8.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar7;
  return (shared_ptr<tonk::gateway::MappedPortLifetime>)
         sVar8.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MappedPortLifetime> RequestPortMap(
    uint16_t localPort,
    const char* interfaceAddress)
{
    std::lock_guard<std::mutex> locker(APILock);

    // If initialization is needed:
    TONK_DEBUG_ASSERT(API_References >= 0);
    if (API_References <= 0)
    {
        TONK_DEBUG_ASSERT(m_PortMapper == nullptr);
        Delete_PortMapper();

        // Allocate port mapper
        m_PortMapper = new(std::nothrow) GatewayPortMapper;
        if (!m_PortMapper) {
            return nullptr; // OOM
        }

        // Initialize background thread and Asio objects
        Result result = m_PortMapper->Initialize(interfaceAddress);
        if (result.IsFail())
        {
            ModuleLogger.Error("Unable to initialize port mapper: ", result.ToJson());
            Delete_PortMapper();
            return nullptr;
        }
    }

    // Create a request lifetime object
    std::shared_ptr<MappedPortLifetime> ref = MakeSharedNoThrow<MappedPortLifetime>();
    if (!ref) {
        return nullptr; // OOM
    }

    // Put in request
    TONK_DEBUG_ASSERT(m_PortMapper);
    if (m_PortMapper)
    {
        AppRequest request;
        request.LocalPort = localPort;
        request.Type = RequestType::Add;
        request.API_LifetimePtr = ref.get();

        ref->Request = request;

        // Insert request
        m_PortMapper->State->API_Request(request);
    }

    // Increment references to API
    ++API_References;

    return ref;
}